

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_viewport.cpp
# Opt level: O1

bool __thiscall ON_Viewport::CopyFrom(ON_Viewport *this,ON_Object *src)

{
  ON_UserData *pOVar1;
  bool bVar2;
  ON_Object *src_00;
  
  if (src == (ON_Object *)0x0) {
    src_00 = (ON_Object *)0x0;
  }
  else {
    bVar2 = ON_Object::IsKindOf(src,&m_ON_Viewport_class_rtti);
    src_00 = (ON_Object *)0x0;
    if (bVar2) {
      src_00 = src;
    }
  }
  if (src_00 != (ON_Object *)0x0) {
    ON_Object::operator=((ON_Object *)this,src_00);
    memcpy(&this->m_bValidCamera,src_00 + 1,0x220);
    pOVar1 = src_00[0x23].m_userdata_list;
    *(_func_int ***)(this->m_projection_content_sha1).m_digest = src_00[0x23]._vptr_ON_Object;
    *(ON_UserData **)((this->m_projection_content_sha1).m_digest + 8) = pOVar1;
    *(undefined4 *)((this->m_projection_content_sha1).m_digest + 0x10) =
         *(undefined4 *)&src_00[0x24]._vptr_ON_Object;
  }
  return src_00 != (ON_Object *)0x0;
}

Assistant:

static double len2d( double x, double y )
{
  double d= 0.0;
  double fx = fabs(x);
  double fy = fabs(y);
  if ( fx > fy ) {
    d = fy/fx;
    d = fx*sqrt(1.0+d*d);
  }
  else if ( fy > fx ){
    d = fx/fy;
    d = fy*sqrt(1.0+d*d);
  }
  return d;
}